

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O2

string * absl::lts_20240722::StrCat<>
                   (string *__return_storage_ptr__,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d,
                   AlphaNum *e)

{
  size_t local_58;
  char *pcStack_50;
  size_t local_48;
  char *pcStack_40;
  size_t local_38;
  char *pcStack_30;
  size_t local_28;
  char *pcStack_20;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  local_58 = (a->piece_)._M_len;
  pcStack_50 = (a->piece_)._M_str;
  local_48 = (b->piece_)._M_len;
  pcStack_40 = (b->piece_)._M_str;
  local_38 = (c->piece_)._M_len;
  pcStack_30 = (c->piece_)._M_str;
  local_28 = (d->piece_)._M_len;
  pcStack_20 = (d->piece_)._M_str;
  local_18 = (undefined4)(e->piece_)._M_len;
  uStack_14 = *(undefined4 *)((long)&(e->piece_)._M_len + 4);
  uStack_10 = *(undefined4 *)&(e->piece_)._M_str;
  uStack_c = *(undefined4 *)((long)&(e->piece_)._M_str + 4);
  absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(__return_storage_ptr__,&local_58,5);
  return __return_storage_ptr__;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string StrCat(
    const AlphaNum& a, const AlphaNum& b, const AlphaNum& c, const AlphaNum& d,
    const AlphaNum& e, const AV&... args) {
  return strings_internal::CatPieces(
      {a.Piece(), b.Piece(), c.Piece(), d.Piece(), e.Piece(),
       static_cast<const AlphaNum&>(args).Piece()...});
}